

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

void object_skin_display(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  wchar_t x;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  wchar_t y;
  int in_stack_ffffffffffffffa8;
  
  x = loc->col;
  iVar1 = loc->row;
  piVar4 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar4 = &menu->count;
  }
  iVar2 = loc->page_rows;
  iVar3 = *piVar4;
  if (0 < *top && cursor <= *top) {
    *top = cursor + -1;
  }
  if (*top + iVar2 + -1 <= cursor) {
    *top = (cursor - iVar2) + 2;
  }
  iVar5 = iVar3 - iVar2;
  if (*top < iVar5) {
    iVar5 = *top;
  }
  iVar6 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  *top = iVar5;
  if (0 < iVar2) {
    do {
      y = iVar1 + iVar6;
      Term_erase(x,y,loc->width);
      if (iVar6 < iVar3) {
        display_menu_row(menu,*top + iVar6,(uint)(iVar6 == cursor - *top),SUB41(y,0),x,loc->width,
                         in_stack_ffffffffffffffa8);
      }
      iVar6 = iVar6 + 1;
    } while (iVar2 != iVar6);
  }
  if (-1 < menu->cursor) {
    Term_gotoxy(x + menu->cursor_x_offset,(iVar1 + cursor) - *top);
    return;
  }
  return;
}

Assistant:

static void object_skin_display(struct menu *menu, int cursor, int *top, region *loc)
{
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int i;

	/* Keep a certain distance from the top when possible */
	if ((cursor <= *top) && (*top > 0))
		*top = cursor - 1;

	/* Keep a certain distance from the bottom when possible */
	if (cursor >= *top + (rows_per_page - 1))
		*top = cursor - (rows_per_page - 1) + 1;

	/* Limit the top to legal places */
	*top = MIN(*top, n - rows_per_page);
	*top = MAX(*top, 0);

	for (i = 0; i < rows_per_page; i++) {
		/* Blank all lines */
		Term_erase(col, row + i, loc->width);
		if (i < n) {
			/* Redraw the line if it's within the number of menu items */
			bool is_curs = (i == cursor - *top);
			display_menu_row(menu, i + *top, *top, is_curs, row + i, col,
							loc->width);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + menu->cursor_x_offset, row + cursor - *top);
}